

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall DirectionCone_BoundBounds_Test::TestBody(DirectionCone_BoundBounds_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  char *in_R9;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar12 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vector3f VVar20;
  undefined1 local_160 [8];
  float local_158;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  float local_118;
  Bounds3f b_1;
  DirectionCone c;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Float theta;
  undefined1 local_98 [16];
  AssertHelper local_88;
  Point2f u;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  RNG rng;
  Bounds3f b;
  undefined1 auVar14 [56];
  
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_._0_4_ = 0.0;
  local_160 = (undefined1  [8])vmovlps_avx(auVar12);
  local_158 = 1.0;
  pbrt::Bounds3<float>::Bounds3(&b,(Point3<float> *)&gtest_ar,(Point3<float> *)local_160);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x3e4ccccd3dcccc;
  gtest_ar.message_.ptr_._0_4_ = 0.3;
  pbrt::BoundSubtendedDirections(&c,&b,(Point3f *)&gtest_ar);
  local_160._0_4_ = -1.0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"std::cos(Pi)","c.cosTheta",(float *)local_160,&c.cosTheta);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x18d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b_1,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_160);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_160 = (undefined1  [8])0x3f000000bf000000;
  local_158 = 0.5;
  pbrt::BoundSubtendedDirections((DirectionCone *)&gtest_ar,&b,(Point3f *)local_160);
  c.cosTheta = gtest_ar.message_.ptr_._4_4_;
  c.w.super_Tuple3<pbrt::Vector3,_float>.z = gtest_ar.message_.ptr_._0_4_;
  c.empty = local_118._0_1_;
  c.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = gtest_ar._0_8_;
  theta = acosf(gtest_ar.message_.ptr_._4_4_);
  local_160 = (undefined1  [8])0x3fee92bc782b6ae8;
  testing::internal::CmpHelperGE<float,double>
            ((internal *)&gtest_ar,"theta","1.0001 * precise",&theta,(double *)local_160);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x197,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b_1,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_160);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_160 = (undefined1  [8])0x3ff0d04644cccccd;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"theta","1.1 * precise",&theta,(double *)local_160);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_160);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x19a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b_1,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_160);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::RNG::SetSequence(&rng,0x200);
  for (iVar8 = 0; iVar8 != 1000; iVar8 = iVar8 + 1) {
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    fVar10 = pbrt::RNG::Uniform<float>(&rng);
    fVar11 = pbrt::RNG::Uniform<float>(&rng);
    auVar17._8_4_ = 0x3f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar17._12_4_ = 0x3f800000;
    gtest_ar.message_.ptr_._0_4_ = fVar11 - (1.0 - fVar11);
    auVar1._4_4_ = extraout_XMM0_Db;
    auVar1._0_4_ = fVar9;
    auVar1._8_4_ = extraout_XMM0_Dc;
    auVar1._12_4_ = extraout_XMM0_Dd;
    auVar12 = vinsertps_avx(auVar1,ZEXT416((uint)fVar10),0x10);
    auVar1 = vsubps_avx(auVar17,auVar12);
    auVar12 = vfnmadd213ps_fma(auVar1,auVar17,auVar12);
    gtest_ar._0_8_ = vmovlps_avx(auVar12);
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    fVar10 = pbrt::RNG::Uniform<float>(&rng);
    local_158 = pbrt::RNG::Uniform<float>(&rng);
    auVar18._8_4_ = 0x3f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar18._12_4_ = 0x3f800000;
    local_158 = local_158 - (1.0 - local_158);
    auVar2._4_4_ = extraout_XMM0_Db_00;
    auVar2._0_4_ = fVar9;
    auVar2._8_4_ = extraout_XMM0_Dc_00;
    auVar2._12_4_ = extraout_XMM0_Dd_00;
    auVar12 = vinsertps_avx(auVar2,ZEXT416((uint)fVar10),0x10);
    auVar1 = vsubps_avx(auVar18,auVar12);
    auVar12 = vfnmadd213ps_fma(auVar1,auVar18,auVar12);
    local_160 = (undefined1  [8])vmovlps_avx(auVar12);
    pbrt::Bounds3<float>::Bounds3(&b_1,(Point3<float> *)&gtest_ar,(Point3<float> *)local_160);
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    fVar10 = pbrt::RNG::Uniform<float>(&rng);
    fVar11 = pbrt::RNG::Uniform<float>(&rng);
    auVar16._8_4_ = 0x3f800000;
    auVar16._0_8_ = 0x3f8000003f800000;
    auVar16._12_4_ = 0x3f800000;
    auVar19._8_4_ = 0x40800000;
    auVar19._0_8_ = 0x4080000040800000;
    auVar19._12_4_ = 0x40800000;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * 4.0)),ZEXT416((uint)(1.0 - fVar11)),
                             ZEXT416(0xc0800000));
    auVar3._4_4_ = extraout_XMM0_Db_01;
    auVar3._0_4_ = fVar9;
    auVar3._8_4_ = extraout_XMM0_Dc_01;
    auVar3._12_4_ = extraout_XMM0_Dd_01;
    auVar12 = vinsertps_avx(auVar3,ZEXT416((uint)fVar10),0x10);
    auVar1 = vsubps_avx(auVar16,auVar12);
    auVar15._0_4_ = auVar12._0_4_ * 4.0;
    auVar15._4_4_ = auVar12._4_4_ * 4.0;
    auVar15._8_4_ = auVar12._8_4_ * 4.0;
    auVar15._12_4_ = auVar12._12_4_ * 4.0;
    auVar12 = vfnmadd231ps_fma(auVar15,auVar19,auVar1);
    local_98._0_8_ = vmovlps_avx(auVar12);
    local_98._8_4_ = auVar2._0_4_;
    pbrt::BoundSubtendedDirections((DirectionCone *)&gtest_ar,&b_1,(Point3<float> *)local_98);
    c.cosTheta = gtest_ar.message_.ptr_._4_4_;
    c.w.super_Tuple3<pbrt::Vector3,_float>.z = gtest_ar.message_.ptr_._0_4_;
    c.empty = local_118._0_1_;
    c.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = gtest_ar._0_8_;
    bVar4 = pbrt::Inside<float>((Point3<float> *)local_98,&b_1);
    if (bVar4) {
      local_160._0_4_ = 0xbf800000;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar,"std::cos(Pi)","c.cosTheta",(float *)local_160,&c.cosTheta);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_160);
        pcVar6 = "";
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
            (undefined8 *)0x0) {
          pcVar6 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                   ,0x1a9,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)local_160);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_160);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    else {
      local_68.x = 0.0;
      local_68.y = 0.0;
      local_78.x = 0.0;
      local_78.y = 0.0;
      local_68.z = 0.0;
      local_78.z = 0.0;
      pbrt::CoordinateSystem<float>(&c.w,(Vector3<float> *)&local_68,(Vector3<float> *)&local_78);
      iVar7 = 1000;
      while (bVar4 = iVar7 != 0, iVar7 = iVar7 + -1, bVar4) {
        fVar9 = pbrt::RNG::Uniform<float>(&rng);
        u.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(&rng);
        auVar14 = extraout_var;
        u.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
        VVar20 = pbrt::SampleUniformSphere(&u);
        local_a8.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar13._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar13._8_56_ = auVar14;
        local_a8._0_8_ = vmovlps_avx(auVar13._0_16_);
        gtest_ar.message_.ptr_._0_4_ = (float)local_98._8_4_;
        gtest_ar._0_8_ = local_98._0_8_;
        gtest_ar.message_.ptr_._4_4_ = local_a8.x;
        local_118 = local_a8.y;
        bVar4 = pbrt::Bounds3<float>::IntersectP
                          (&b_1,(Point3f *)&gtest_ar,(Vector3f *)((long)&gtest_ar.message_.ptr_ + 4)
                           ,INFINITY,(Float *)0x0,(Float *)0x0);
        if (bVar4) {
          gtest_ar_.success_ = pbrt::Inside(&c,(Vector3f *)&local_a8);
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_140);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_160,(internal *)&gtest_ar_,(AssertionResult *)"Inside(c, w)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                       ,0x1b3,(char *)local_160);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_140);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            std::__cxx11::string::~string((string *)local_160);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_140);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
        }
        bVar5 = pbrt::Inside(&c,(Vector3f *)&local_a8);
        if (!bVar5) {
          gtest_ar_.success_ = !bVar4;
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_140);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_160,(internal *)&gtest_ar_,(AssertionResult *)"hit","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                       ,0x1b5,(char *)local_160);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_140);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            std::__cxx11::string::~string((string *)local_160);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_140);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(DirectionCone, BoundBounds) {
    Bounds3f b(Point3f(0, 0, 0), Point3f(1, 1, 1));

    // Point inside the bbox
    DirectionCone c = BoundSubtendedDirections(b, Point3f(.1, .2, .3));
    EXPECT_EQ(std::cos(Pi), c.cosTheta);

    // Outside, .5 units away in the middle (so using the direction to the
    // center gives the best bound).
    //
    // tan theta = (sqrt(.5^2 + .5^2)) / .5
    c = BoundSubtendedDirections(b, Point3f(-.5, .5, .5));
    Float theta = std::acos(c.cosTheta);
    Float precise = std::atan(std::sqrt(.5 * .5 + .5 * .5) / .5);
    // Make sure the returned bound isn't too small.
    EXPECT_GE(theta, 1.0001 * precise);
    // It's fine for it to be a bit big (as it is in practice due to
    // approximations for performance), but it shouldn't be too big.
    EXPECT_LT(theta, 1.1 * precise);

    RNG rng(512);
    for (int i = 0; i < 1000; ++i) {
        Bounds3f b(
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)),
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)));

        Point3f p(Lerp(rng.Uniform<Float>(), -4, 4), Lerp(rng.Uniform<Float>(), -4, 4),
                  Lerp(rng.Uniform<Float>(), -4, 4));

        c = BoundSubtendedDirections(b, p);
        if (Inside(p, b))
            EXPECT_EQ(std::cos(Pi), c.cosTheta);
        else {
            Vector3f wx, wy;
            CoordinateSystem(c.w, &wx, &wy);
            for (int j = 0; j < 1000; ++j) {
                Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
                Vector3f w = SampleUniformSphere(u);
                Ray r(p, w);
                bool hit = b.IntersectP(r.o, r.d);
                if (hit)
                    EXPECT_TRUE(Inside(c, w));
                if (!Inside(c, w))
                    EXPECT_FALSE(hit);
            }
        }
    }
}